

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::currentChanged(QFileDialogPrivate *this,QModelIndex *index)

{
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialogPrivate *in_stack_00000008;
  QString *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffffa0;
  int arole;
  QModelIndex *this_00;
  QModelIndex local_28;
  long local_8;
  
  arole = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  updateOkButton(in_stack_00000008);
  q_func(in_RDI);
  this_00 = &local_28;
  QModelIndex::data(this_00,arole);
  ::QVariant::toString();
  QFileDialog::currentChanged((QFileDialog *)in_RDI,in_stack_ffffffffffffff88);
  QString::~QString((QString *)0x75f9e4);
  ::QVariant::~QVariant((QVariant *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::currentChanged(const QModelIndex &index)
{
    updateOkButton();
    emit q_func()->currentChanged(index.data(QFileSystemModel::FilePathRole).toString());
}